

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall duckdb::JoinHashTable::Reset(JoinHashTable *this)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer this_01;
  TemplatedValidityData<unsigned_long> *pTVar4;
  unsigned_long uVar5;
  ulong uVar6;
  long lVar7;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_28;
  
  this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(&this->data_collection);
  TupleDataCollection::Reset(this_01);
  AllocatedData::Reset(&this->hash_map);
  uVar1 = this->radix_bits;
  lVar7 = 1L << ((byte)uVar1 & 0x3f);
  if ((this->current_partitions).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    local_28 = (this->current_partitions).super_TemplatedValidityMask<unsigned_long>.capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_38,&local_28);
    p_Var3 = p_Stack_30;
    peVar2 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->current_partitions).super_TemplatedValidityMask<unsigned_long>.validity_data.
              internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->current_partitions).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar2;
    (this->current_partitions).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
    pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(this->current_partitions).super_TemplatedValidityMask<unsigned_long>.
                         validity_data);
    (this->current_partitions).super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         (pTVar4->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
  }
  uVar6 = lVar7 + 0x3fU >> 6;
  if (uVar6 != 1) {
    switchD_01306cb1::default
              ((this->current_partitions).super_TemplatedValidityMask<unsigned_long>.validity_mask,0
               ,uVar6 * 8 - 8);
  }
  uVar5 = 0;
  if (uVar1 < 6) {
    uVar5 = -1L << ((byte)lVar7 & 0x3f);
  }
  (this->current_partitions).super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 - 1] =
       uVar5;
  this->finalized = false;
  return;
}

Assistant:

void JoinHashTable::Reset() {
	data_collection->Reset();
	hash_map.Reset();
	current_partitions.SetAllInvalid(RadixPartitioning::NumberOfPartitions(radix_bits));
	finalized = false;
}